

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

Vec_Ptr_t * Bmc_MnaTernary(Gia_Man_t *p,int nFrames,int nFramesAdd,int fVerbose,int *iFirst)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Obj_t *pGVar6;
  void *pvVar7;
  void **__ptr;
  char *pcVar8;
  abctime aVar9;
  abctime time;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong local_58;
  ulong uStack_50;
  abctime local_40;
  size_t local_38;
  
  uVar12 = p->vCos->nSize;
  local_40 = Abc_Clock();
  p->pObjs->Value = 1;
  for (iVar10 = 0; iVar10 < p->vCis->nSize - p->nRegs; iVar10 = iVar10 + 1) {
    pGVar4 = Gia_ManCi(p,iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->Value = 3;
  }
  for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->Value = 1;
  }
  *iFirst = -1;
  pVVar5 = Vec_PtrAlloc(100);
  local_38 = (long)(int)((((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0)) << 2;
  uVar12 = 0;
  do {
    if ((nFrames != 0 && uVar12 == nFrames) ||
       ((nFrames == 0 && (-1 < *iFirst && uVar12 == *iFirst + nFramesAdd)))) {
      if (fVerbose != 0) {
        pcVar8 = (char *)(ulong)(uint)nFrames;
        printf("Finished %d frames. First x-valued PO is in frame %d.  ",pcVar8,(ulong)(uint)*iFirst
              );
        aVar9 = Abc_Clock();
        Abc_PrintTime((int)aVar9 - (int)local_40,pcVar8,time);
      }
      return pVVar5;
    }
    for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar6->Value = pGVar4->Value;
    }
    for (iVar10 = 0; iVar10 < p->nObjs; iVar10 = iVar10 + 1) {
      pGVar4 = Gia_ManObj(p,iVar10);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)pGVar4;
      if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar15) {
        uVar13 = (pGVar4[-(ulong)((uint)(uVar15 >> 0x20) & 0x1fffffff)].Value == 3 ||
                 pGVar4[-(uVar15 & 0x1fffffff)].Value == 3) | 2;
        if (((uVar15 >> 0x3d & 1) != 0) + 1 ==
            pGVar4[-(ulong)((uint)(uVar15 >> 0x20) & 0x1fffffff)].Value) {
          uVar13 = 1;
        }
        if ((((uint)uVar15 >> 0x1d & 1) != 0) + 1 == pGVar4[-(uVar15 & 0x1fffffff)].Value) {
          uVar13 = 1;
        }
        pGVar4->Value = uVar13;
      }
    }
    pvVar7 = malloc(local_38);
    bVar14 = 0;
    for (uVar13 = 0; (int)uVar13 < p->vCos->nSize; uVar13 = uVar13 + 1) {
      pGVar4 = Gia_ManCo(p,uVar13);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar11 = ((((uint)*(undefined8 *)pGVar4 >> 0x1d & 1) != 0) + 1 !=
               pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value) + 1;
      if (pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value == 3) {
        uVar11 = 3;
      }
      pGVar4->Value = uVar11;
      uVar2 = *(uint *)((long)pvVar7 + (ulong)(uVar13 >> 4) * 4);
      *(uint *)((long)pvVar7 + (ulong)(uVar13 >> 4) * 4) =
           (uVar2 >> (bVar14 & 0x1e) & 3 ^ uVar11) << (bVar14 & 0x1e) ^ uVar2;
      if (((*iFirst == -1) && ((int)uVar13 < p->vCos->nSize - p->nRegs)) && (pGVar4->Value == 3)) {
        *iFirst = uVar12;
      }
      bVar14 = bVar14 + 2;
    }
    iVar10 = pVVar5->nSize;
    if (iVar10 == pVVar5->nCap) {
      uVar15 = (ulong)(uint)(iVar10 * 2);
      if (iVar10 < 0x10) {
        uVar15 = 0x10;
      }
      __ptr = pVVar5->pArray;
      if (iVar10 < (int)uVar15) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc(uVar15 << 3);
        }
        else {
          __ptr = (void **)realloc(__ptr,uVar15 << 3);
        }
        pVVar5->pArray = __ptr;
        pVVar5->nCap = (int)uVar15;
      }
    }
    else {
      __ptr = pVVar5->pArray;
    }
    pVVar5->nSize = iVar10 + 1;
    __ptr[iVar10] = pvVar7;
    if (fVerbose != 0) {
      local_58 = 0;
      uStack_50 = 0;
      for (iVar10 = 0; uVar13 = p->nRegs, iVar10 < (int)uVar13; iVar10 = iVar10 + 1) {
        pGVar4 = Gia_ManCo(p,(p->vCos->nSize - uVar13) + iVar10);
        if (pGVar4 == (Gia_Obj_t *)0x0) {
          uVar13 = p->nRegs;
          break;
        }
        piVar1 = (int *)((long)&local_58 + (ulong)pGVar4->Value * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar15 = local_58 >> 0x20;
      uVar16 = uStack_50 & 0xffffffff;
      uVar3 = uStack_50 >> 0x20;
      pGVar4 = Gia_ManPo(p,0);
      pcVar8 = "0";
      if (pGVar4->Value == 3) {
        pcVar8 = "x";
      }
      printf("%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n",(ulong)uVar12,uVar15,uVar16
             ,uVar3,(ulong)uVar13,pcVar8);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Bmc_MnaTernary( Gia_Man_t * p, int nFrames, int nFramesAdd, int fVerbose, int * iFirst )
{
    Vec_Ptr_t * vStates;
    unsigned * pState;
    int nStateWords = Abc_BitWordNum( 2*Gia_ManCoNum(p) );
    Gia_Obj_t * pObj, * pObjRo;
    int f, i, Count[4];
    abctime clk = Abc_Clock();
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = GIA_UND;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = GIA_ZER;
    *iFirst = -1;
    vStates = Vec_PtrAlloc( 100 );
    for ( f = 0; ; f++ )
    {
        // if frames are given, break at frames
        if ( nFrames && f == nFrames )
            break;
        // if frames are not given, break after nFramesAdd from the first x-valued
        if ( !nFrames && *iFirst >= 0 && f == *iFirst + nFramesAdd )
            break;
        // aassign CI values
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value = pObj->Value;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
        // compute and save CO values
        pState = ABC_ALLOC( unsigned, nStateWords );
        Gia_ManForEachCo( p, pObj, i )
        {
            pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            Gia_ManTerSimInfoSet( pState, i, pObj->Value );
            if ( *iFirst == -1 && i < Gia_ManPoNum(p) && pObj->Value == GIA_UND )
                *iFirst = f;
        }
        Vec_PtrPush( vStates, pState );
        // print statistics
        if ( !fVerbose )
            continue;
        Count[0] = Count[1] = Count[2] = Count[3] = 0;
        Gia_ManForEachRi( p, pObj, i )
            Count[pObj->Value]++;
        printf( "%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n", 
            f, Count[GIA_ZER], Count[GIA_ONE], Count[GIA_UND], Gia_ManRegNum(p), 
            Gia_ManPo(p, 0)->Value == GIA_UND ? "x" : "0" );  
    }
//    assert( Vec_PtrSize(vStates) == nFrames );
    if ( fVerbose )
        printf( "Finished %d frames. First x-valued PO is in frame %d.  ", nFrames, *iFirst );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vStates;
}